

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viff.cxx
# Opt level: O0

void vigra::map_multiband<unsigned_short,unsigned_short>
               (void_vector<unsigned_short> *dest,uint *dest_bands,void_vector<unsigned_short> *src,
               uint src_bands,uint src_width,uint src_height,void_vector<unsigned_short> *maps,
               uint map_bands,uint map_width,uint map_height)

{
  value_type_conflict3 *pvVar1;
  uint *in_RSI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint i_2;
  uint bandnum_1;
  uint i_1;
  uint bandnum;
  uint band_size;
  uint i;
  colormap_type colormap;
  uint map_band_size;
  uint num_pixels;
  undefined6 in_stack_ffffffffffffff58;
  value_type_conflict3 in_stack_ffffffffffffff5e;
  void_vector<unsigned_short> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  value_type_conflict3 in_stack_ffffffffffffff6e;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar2;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar3;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_5c;
  
  throw_precondition_error
            (SUB41((uint)in_stack_ffffffffffffff84 >> 0x18,0),in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70,CONCAT22(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff6c)
            );
  colormap<unsigned_short,_unsigned_short>::colormap
            ((colormap<unsigned_short,_unsigned_short> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(uint)in_stack_ffffffffffffff78,
             (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  for (local_5c = 0; local_5c < in_stack_00000010; local_5c = local_5c + 1) {
    pvVar1 = void_vector<unsigned_short>::data((void_vector<unsigned_short> *)0x1a2fb6);
    colormap<unsigned_short,_unsigned_short>::initialize
              ((colormap<unsigned_short,_unsigned_short> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),pvVar1,
               (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  }
  *in_RSI = in_stack_00000010 * in_stack_00000018;
  void_vector<unsigned_short>::resize
            (in_stack_ffffffffffffff60,CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)
            );
  if (in_stack_00000018 < 2) {
    for (uVar3 = 0; uVar3 < *in_RSI; uVar3 = uVar3 + 1) {
      for (uVar2 = 0; uVar2 < (uint)(in_R8D * in_R9D); uVar2 = uVar2 + 1) {
        in_stack_ffffffffffffff60 =
             (void_vector<unsigned_short> *)
             void_vector<unsigned_short>::operator[]
                       (in_stack_ffffffffffffff60,
                        CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff5e =
             colormap<unsigned_short,_unsigned_short>::operator()
                       ((colormap<unsigned_short,_unsigned_short> *)
                        CONCAT26(in_stack_ffffffffffffff6e,
                                 CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
                        (domain_type_conflict)((ulong)in_stack_ffffffffffffff60 >> 0x30),
                        (uint)in_stack_ffffffffffffff60);
        pvVar1 = void_vector<unsigned_short>::operator[]
                           (in_stack_ffffffffffffff60,
                            CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58));
        *pvVar1 = in_stack_ffffffffffffff5e;
      }
    }
  }
  else {
    for (local_74 = 0; local_74 < *in_RSI; local_74 = local_74 + 1) {
      for (local_78 = 0; local_78 < (uint)(in_R8D * in_R9D); local_78 = local_78 + 1) {
        void_vector<unsigned_short>::operator[]
                  (in_stack_ffffffffffffff60,
                   CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff6e =
             colormap<unsigned_short,_unsigned_short>::operator()
                       ((colormap<unsigned_short,_unsigned_short> *)
                        CONCAT26(in_stack_ffffffffffffff6e,
                                 CONCAT24(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
                        (domain_type_conflict)((ulong)in_stack_ffffffffffffff60 >> 0x30),
                        (uint)in_stack_ffffffffffffff60);
        pvVar1 = void_vector<unsigned_short>::operator[]
                           (in_stack_ffffffffffffff60,
                            CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58));
        *pvVar1 = in_stack_ffffffffffffff6e;
      }
    }
  }
  colormap<unsigned_short,_unsigned_short>::~colormap
            ((colormap<unsigned_short,_unsigned_short> *)0x1a31e4);
  return;
}

Assistant:

void map_multiband( void_vector<map_storage_type> & dest,
                        unsigned int & dest_bands,
                        const void_vector<storage_type> & src,
                        unsigned int src_bands, unsigned int src_width, unsigned int src_height,
                        const void_vector<map_storage_type> & maps,
                        unsigned int map_bands, unsigned int map_width, unsigned int map_height )
    {
        vigra_precondition(src_bands == 1u,
               "map_multiband(): Source image must have one band.");

        typedef colormap< storage_type, map_storage_type > colormap_type;
        const unsigned int num_pixels = src_width * src_height;

        // build the color map
        const unsigned int map_band_size = map_width * map_height;
        colormap_type colormap( map_height, map_bands, map_width );
        for ( unsigned int i = 0; i < map_bands; ++i )
            colormap.initialize( maps.data() + map_band_size * i, i );

        // map each pixel
        const unsigned int band_size = src_width * src_height;
        dest_bands = map_bands * map_width;
        dest.resize( band_size * dest_bands );
        if ( map_width > 1 ) {
            // interleaved maps => there is only one band in the image
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[i], bandnum );
        } else {
            // non-interleaved bands => map can be used per band
            for( unsigned int bandnum = 0; bandnum < dest_bands; ++bandnum )
                for( unsigned int i = 0; i < num_pixels; ++i )
                    dest[ bandnum * band_size + i ]
                        = colormap( src[ bandnum * band_size + i ], bandnum );
        }
    }